

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void StoreTrivialContextMap
               (size_t num_types,size_t context_bits,HuffmanTree *tree,size_t *storage_ix,
               uint8_t *storage)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong histogram_length;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  int iVar12;
  undefined1 auVar11 [16];
  undefined8 local_7b0;
  uint8_t depths [272];
  uint16_t bits [272];
  uint32_t histogram [272];
  
  StoreVarLenUint8(num_types - 1,storage_ix,storage);
  if (1 < num_types) {
    lVar1 = context_bits - 1;
    histogram_length = (context_bits + num_types) - 1;
    local_7b0 = tree;
    memset(histogram,0,histogram_length * 4);
    uVar5 = *storage_ix;
    *(ulong *)(storage + (uVar5 >> 3)) = (ulong)storage[uVar5 >> 3] | 1L << ((byte)uVar5 & 7);
    uVar6 = uVar5 + 1;
    *storage_ix = uVar6;
    *(size_t *)(storage + (uVar6 >> 3)) =
         context_bits - 2 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
    *storage_ix = uVar5 + 5;
    histogram[context_bits - 1] = (uint32_t)num_types;
    histogram[0] = 1;
    if (context_bits < histogram_length) {
      lVar4 = num_types - 2;
      auVar8._8_4_ = (int)lVar4;
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar6 = 0;
      auVar8 = auVar8 ^ _DAT_00132090;
      do {
        auVar10._8_4_ = (int)uVar6;
        auVar10._0_8_ = uVar6;
        auVar10._12_4_ = (int)(uVar6 >> 0x20);
        auVar11 = (auVar10 | _DAT_00132080) ^ _DAT_00132090;
        iVar9 = auVar8._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar9 && auVar8._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_
                    ) & 1)) {
          histogram[context_bits + uVar6] = 1;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          histogram[context_bits + uVar6 + 1] = 1;
        }
        auVar10 = (auVar10 | _DAT_00132070) ^ _DAT_00132090;
        iVar12 = auVar10._4_4_;
        if (iVar12 <= iVar9 && (iVar12 != iVar9 || auVar10._0_4_ <= auVar8._0_4_)) {
          histogram[context_bits + uVar6 + 2] = 1;
          histogram[context_bits + uVar6 + 3] = 1;
        }
        uVar6 = uVar6 + 4;
      } while ((num_types + 2 & 0xfffffffffffffffc) != uVar6);
    }
    BuildAndStoreHuffmanTree
              (histogram,histogram_length,histogram_length,local_7b0,depths,bits,storage_ix,storage)
    ;
    bVar2 = depths[context_bits - 1];
    uVar3 = bits[context_bits - 1];
    uVar6 = *storage_ix;
    sVar7 = 0;
    do {
      lVar4 = sVar7 + lVar1;
      if (sVar7 == 0) {
        lVar4 = 0;
      }
      uVar5 = depths[lVar4] + uVar6;
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)bits[lVar4] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      *storage_ix = uVar5;
      *(ulong *)(storage + (uVar5 >> 3)) =
           (ulong)uVar3 << ((byte)uVar5 & 7) | (ulong)storage[uVar5 >> 3];
      uVar5 = uVar5 + bVar2;
      *storage_ix = uVar5;
      *(ulong *)(storage + (uVar5 >> 3)) =
           (ulong)(uint)~(-1 << ((byte)lVar1 & 0x1f)) << ((byte)uVar5 & 7) |
           (ulong)storage[uVar5 >> 3];
      uVar6 = uVar5 + lVar1;
      *storage_ix = uVar6;
      sVar7 = sVar7 + 1;
    } while (num_types != sVar7);
    *(ulong *)(storage + (uVar6 >> 3)) = (ulong)storage[uVar6 >> 3] | 1L << ((byte)uVar6 & 7);
    *storage_ix = uVar5 + context_bits;
  }
  return;
}

Assistant:

static void StoreTrivialContextMap(size_t num_types,
                                   size_t context_bits,
                                   HuffmanTree* tree,
                                   size_t* storage_ix,
                                   uint8_t* storage) {
  StoreVarLenUint8(num_types - 1, storage_ix, storage);
  if (num_types > 1) {
    size_t repeat_code = context_bits - 1u;
    size_t repeat_bits = (1u << repeat_code) - 1u;
    size_t alphabet_size = num_types + repeat_code;
    uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
    size_t i;
    memset(histogram, 0, alphabet_size * sizeof(histogram[0]));
    /* Write RLEMAX. */
    BrotliWriteBits(1, 1, storage_ix, storage);
    BrotliWriteBits(4, repeat_code - 1, storage_ix, storage);
    histogram[repeat_code] = (uint32_t)num_types;
    histogram[0] = 1;
    for (i = context_bits; i < alphabet_size; ++i) {
      histogram[i] = 1;
    }
    BuildAndStoreHuffmanTree(histogram, alphabet_size, alphabet_size,
                             tree, depths, bits, storage_ix, storage);
    for (i = 0; i < num_types; ++i) {
      size_t code = (i == 0 ? 0 : i + context_bits - 1);
      BrotliWriteBits(depths[code], bits[code], storage_ix, storage);
      BrotliWriteBits(
          depths[repeat_code], bits[repeat_code], storage_ix, storage);
      BrotliWriteBits(repeat_code, repeat_bits, storage_ix, storage);
    }
    /* Write IMTF (inverse-move-to-front) bit. */
    BrotliWriteBits(1, 1, storage_ix, storage);
  }
}